

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_list.cpp
# Opt level: O1

iterator __thiscall
spvtools::opt::InstructionList::iterator::InsertBefore
          (iterator *this,
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          *i)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  long *in_RDX;
  
  pIVar1 = (Instruction *)*in_RDX;
  if ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) {
    __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                  ,0xae,
                  "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                 );
  }
  pIVar2 = (i->_M_t).
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ != (Instruction *)0x0
     ) {
    pIVar3 = (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (pIVar3 != (Instruction *)0x0) {
      (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar3;
      (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
      (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)0x0;
    }
    (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar2;
    (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
         (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
    (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar1;
    (((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
    super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar1;
    pIVar1 = (Instruction *)*in_RDX;
    *in_RDX = 0;
    (this->super_iterator).node_ = pIVar1;
    return (iterator)(iterator)this;
  }
  __assert_fail("pos->IsInAList() && \"Pos should already be in a list.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                ,0xaf,
                "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
               );
}

Assistant:

InstructionList::iterator InstructionList::iterator::InsertBefore(
    std::unique_ptr<Instruction>&& i) {
  i.get()->InsertBefore(node_);
  return iterator(i.release());
}